

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-power.c
# Opt level: O0

int32_t slay_power(object *obj,wchar_t p,wchar_t verbose,wchar_t dice_pwr)

{
  uint uVar1;
  slay *s;
  brand *b;
  int local_38;
  wchar_t best_power;
  wchar_t num_kills;
  wchar_t num_slays;
  wchar_t num_brands;
  wchar_t q;
  wchar_t i;
  wchar_t dice_pwr_local;
  wchar_t verbose_local;
  wchar_t p_local;
  object *obj_local;
  
  num_kills = L'\0';
  best_power = L'\0';
  local_38 = 0;
  b._4_4_ = 1;
  if (obj->brands != (_Bool *)0x0) {
    for (num_brands = L'\x01'; num_brands < (int)(uint)z_info->brand_max;
        num_brands = num_brands + L'\x01') {
      if (((obj->brands[num_brands] & 1U) != 0) &&
         (num_kills = num_kills + L'\x01', (int)b._4_4_ < brands[num_brands].power)) {
        b._4_4_ = brands[num_brands].power;
      }
    }
  }
  if (obj->slays != (_Bool *)0x0) {
    for (num_brands = L'\x01'; num_brands < (int)(uint)z_info->slay_max;
        num_brands = num_brands + L'\x01') {
      if ((obj->slays[num_brands] & 1U) != 0) {
        if (slays[num_brands].multiplier < 4) {
          best_power = best_power + L'\x01';
        }
        else {
          local_38 = local_38 + 1;
        }
        if ((int)b._4_4_ < slays[num_brands].power) {
          b._4_4_ = slays[num_brands].power;
        }
      }
    }
  }
  obj_local._4_4_ = p;
  if (best_power + num_kills + local_38 != 0) {
    if (verbose != L'\0') {
      log_obj("Slay and brands: ");
      if (obj->brands != (_Bool *)0x0) {
        for (num_brands = L'\x01'; num_brands < (int)(uint)z_info->brand_max;
            num_brands = num_brands + L'\x01') {
          if ((obj->brands[num_brands] & 1U) != 0) {
            log_obj("%sx%d ",brands[num_brands].name,(ulong)(uint)brands[num_brands].multiplier);
          }
        }
      }
      if (obj->slays != (_Bool *)0x0) {
        for (num_brands = L'\x01'; num_brands < (int)(uint)z_info->slay_max;
            num_brands = num_brands + L'\x01') {
          if ((obj->slays[num_brands] & 1U) != 0) {
            log_obj("%sx%d ",slays[num_brands].name,(ulong)(uint)slays[num_brands].multiplier);
          }
        }
      }
      log_obj("\nbest power is : %d\n",(ulong)b._4_4_);
    }
    uVar1 = (dice_pwr * dice_pwr * (b._4_4_ - 100)) / 0x9c4;
    dice_pwr_local = uVar1 + p;
    log_obj("Add %d for slay power, total is %d\n",(ulong)uVar1,(ulong)(uint)dice_pwr_local);
    if (L'\x01' < best_power) {
      uVar1 = (best_power * best_power * dice_pwr) / 0x19;
      dice_pwr_local = uVar1 + dice_pwr_local;
      log_obj("Add %d power for multiple slays, total is %d\n",(ulong)uVar1,
              (ulong)(uint)dice_pwr_local);
    }
    if (L'\x01' < num_kills) {
      uVar1 = (num_kills * 2 * num_kills * dice_pwr) / 0x19;
      dice_pwr_local = uVar1 + dice_pwr_local;
      log_obj("Add %d power for multiple brands, total is %d\n",(ulong)uVar1,
              (ulong)(uint)dice_pwr_local);
    }
    if ((best_power != L'\0') && (num_kills != L'\0')) {
      uVar1 = (best_power * num_kills * dice_pwr) / 0x19;
      dice_pwr_local = uVar1 + dice_pwr_local;
      log_obj("Add %d power for slay and brand, total is %d\n",(ulong)uVar1,
              (ulong)(uint)dice_pwr_local);
    }
    if (1 < local_38) {
      uVar1 = (local_38 * 3 * local_38 * dice_pwr) / 0x19;
      dice_pwr_local = uVar1 + dice_pwr_local;
      log_obj("Add %d power for multiple kills, total is %d\n",(ulong)uVar1,
              (ulong)(uint)dice_pwr_local);
    }
    if (best_power == L'\b') {
      dice_pwr_local = dice_pwr_local + L'\n';
      log_obj("Add 10 power for full set of slays, total is %d\n",(ulong)(uint)dice_pwr_local);
    }
    if (num_kills == L'\x05') {
      dice_pwr_local = dice_pwr_local + L'\x14';
      log_obj("Add 20 power for full set of brands, total is %d\n",(ulong)(uint)dice_pwr_local);
    }
    if (local_38 == 3) {
      dice_pwr_local = dice_pwr_local + L'\x14';
      log_obj("Add 20 power for full set of kills, total is %d\n",(ulong)(uint)dice_pwr_local);
    }
    obj_local._4_4_ = dice_pwr_local;
  }
  return obj_local._4_4_;
}

Assistant:

static int32_t slay_power(const struct object *obj, int p, int verbose,
					   int dice_pwr)
{
	int i, q, num_brands = 0, num_slays = 0, num_kills = 0;
	int best_power = 1;

	/* Count the brands and slays */
	if (obj->brands) {
		for (i = 1; i < z_info->brand_max; i++) {
			if (obj->brands[i]) {
				num_brands++;
				if (brands[i].power > best_power)
					best_power = brands[i].power;
			}
		}
	}
	if (obj->slays) {
		for (i = 1; i < z_info->slay_max; i++) {
			if (obj->slays[i]) {
				if (slays[i].multiplier <= 3) {
					num_slays++;
				} else {
					num_kills++;
				}
				if (slays[i].power > best_power)
					best_power = slays[i].power;
			}
		}
	}

	/* If there are no slays or brands return */
	if ((num_slays + num_brands + num_kills) == 0)
		return p;

	/* Write the best power */
	if (verbose) {
		/* Write info about the slay combination and multiplier */
		log_obj("Slay and brands: ");

		if (obj->brands) {
			for (i = 1; i < z_info->brand_max; i++) {
				if (obj->brands[i]) {
					struct brand *b = &brands[i];
					log_obj("%sx%d ", b->name,
						b->multiplier);
				}
			}
		}
		if (obj->slays) {
			for (i = 1; i < z_info->slay_max; i++) {
				if (obj->slays[i]) {
					struct slay *s = &slays[i];
					log_obj("%sx%d ", s->name,
						s->multiplier);
				}
			}
		}
		log_obj("\nbest power is : %d\n", best_power);
	}

	q = (dice_pwr * dice_pwr * (best_power - 100)) / 2500;
	p += q;
	log_obj("Add %d for slay power, total is %d\n", q, p);

	/* Bonuses for multiple brands and slays */
	if (num_slays > 1) {
		q = (num_slays * num_slays * dice_pwr) / (DAMAGE_POWER * 5);
		p += q;
		log_obj("Add %d power for multiple slays, total is %d\n", q, p);
	}
	if (num_brands > 1) {
		q = (2 * num_brands * num_brands * dice_pwr) / (DAMAGE_POWER * 5);
		p += q;
		log_obj("Add %d power for multiple brands, total is %d\n",
			q, p);
	}
	if (num_slays && num_brands) {
		q = (num_slays * num_brands * dice_pwr) / (DAMAGE_POWER * 5);
		p += q;
		log_obj("Add %d power for slay and brand, total is %d\n", q, p);
	}
	if (num_kills > 1) {
		q = (3 * num_kills * num_kills * dice_pwr) / (DAMAGE_POWER * 5);
		p += q;
		log_obj("Add %d power for multiple kills, total is %d\n", q, p);
	}
	if (num_slays == 8) {
		p += 10;
		log_obj("Add 10 power for full set of slays, total is %d\n", p);
	}
	if (num_brands == 5) {
		p += 20;
		log_obj("Add 20 power for full set of brands, total"
			" is %d\n", p);
	}
	if (num_kills == 3) {
		p += 20;
		log_obj("Add 20 power for full set of kills, total is %d\n", p);
	}

	return p;
}